

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O2

char * rapidxml::xml_document<char>::
       skip_and_expand_character_refs<rapidxml::xml_document<char>::text_pred,rapidxml::xml_document<char>::text_pure_no_ws_pred,0>
                 (char **text)

{
  byte *pbVar1;
  char cVar2;
  char cVar3;
  unsigned_long uVar4;
  undefined8 *puVar5;
  unsigned_long code;
  char *pcVar6;
  char *dest;
  
  skip<rapidxml::xml_document<char>::text_pure_no_ws_pred,0>(text);
  pcVar6 = *text;
  dest = pcVar6;
LAB_00e4e972:
  cVar2 = *pcVar6;
  if (cVar2 == '&') {
    cVar3 = pcVar6[1];
    if (cVar3 == '#') {
      if (pcVar6[2] == 'x') {
        pcVar6 = pcVar6 + 2;
        uVar4 = 0;
        do {
          code = uVar4;
          pbVar1 = (byte *)(pcVar6 + 1);
          pcVar6 = pcVar6 + 1;
          uVar4 = code * 0x10 + (ulong)(byte)internal::lookup_tables<0>::lookup_digits[*pbVar1];
        } while ((ulong)(byte)internal::lookup_tables<0>::lookup_digits[*pbVar1] != 0xff);
      }
      else {
        pcVar6 = pcVar6 + 1;
        uVar4 = 0;
        do {
          code = uVar4;
          pbVar1 = (byte *)(pcVar6 + 1);
          pcVar6 = pcVar6 + 1;
          uVar4 = code * 10 + (ulong)(byte)internal::lookup_tables<0>::lookup_digits[*pbVar1];
        } while ((ulong)(byte)internal::lookup_tables<0>::lookup_digits[*pbVar1] != 0xff);
      }
      insert_coded_character<0>(&dest,code);
      if (*pcVar6 != ';') {
        puVar5 = (undefined8 *)__cxa_allocate_exception(0x18);
        *puVar5 = &PTR__exception_01198c58;
        puVar5[1] = "expected ;";
        puVar5[2] = pcVar6;
        __cxa_throw(puVar5,&parse_error::typeinfo,std::exception::~exception);
      }
      pcVar6 = pcVar6 + 1;
      goto LAB_00e4e972;
    }
    if (cVar3 == 'q') {
      if ((((pcVar6[2] == 'u') && (pcVar6[3] == 'o')) && (pcVar6[4] == 't')) && (pcVar6[5] == ';'))
      {
        *dest = '\"';
LAB_00e4eb05:
        dest = dest + 1;
        pcVar6 = pcVar6 + 6;
        goto LAB_00e4e972;
      }
    }
    else if (cVar3 == 'g') {
      if ((pcVar6[2] == 't') && (pcVar6[3] == ';')) {
        *dest = '>';
LAB_00e4ea66:
        dest = dest + 1;
        pcVar6 = pcVar6 + 4;
        goto LAB_00e4e972;
      }
    }
    else if (cVar3 == 'l') {
      if ((pcVar6[2] == 't') && (pcVar6[3] == ';')) {
        *dest = '<';
        goto LAB_00e4ea66;
      }
    }
    else {
      if (cVar3 != 'a') goto LAB_00e4e98c;
      if (pcVar6[2] == 'p') {
        if (((pcVar6[3] == 'o') && (pcVar6[4] == 's')) && (pcVar6[5] == ';')) {
          *dest = '\'';
          goto LAB_00e4eb05;
        }
      }
      else if (((pcVar6[2] == 'm') && (pcVar6[3] == 'p')) && (pcVar6[4] == ';')) {
        pcVar6 = pcVar6 + 5;
        *dest = '&';
        dest = dest + 1;
        goto LAB_00e4e972;
      }
    }
  }
  else if ((cVar2 == '\0') || (cVar2 == '<')) {
    *text = pcVar6;
    return dest;
  }
LAB_00e4e98c:
  pcVar6 = pcVar6 + 1;
  *dest = cVar2;
  dest = dest + 1;
  goto LAB_00e4e972;
}

Assistant:

static Ch *skip_and_expand_character_refs(Ch *&text)
        {
            // If entity translation, whitespace condense and whitespace trimming is disabled, use plain skip
            if (Flags & parse_no_entity_translation && 
                !(Flags & parse_normalize_whitespace) &&
                !(Flags & parse_trim_whitespace))
            {
                skip<StopPred, Flags>(text);
                return text;
            }
            
            // Use simple skip until first modification is detected
            skip<StopPredPure, Flags>(text);

            // Use translation skip
            Ch *src = text;
            Ch *dest = src;
            while (StopPred::test(*src))
            {
                // If entity translation is enabled    
                if (!(Flags & parse_no_entity_translation))
                {
                    // Test if replacement is needed
                    if (src[0] == Ch('&'))
                    {
                        switch (src[1])
                        {

                        // &amp; &apos;
                        case Ch('a'): 
                            if (src[2] == Ch('m') && src[3] == Ch('p') && src[4] == Ch(';'))
                            {
                                *dest = Ch('&');
                                ++dest;
                                src += 5;
                                continue;
                            }
                            if (src[2] == Ch('p') && src[3] == Ch('o') && src[4] == Ch('s') && src[5] == Ch(';'))
                            {
                                *dest = Ch('\'');
                                ++dest;
                                src += 6;
                                continue;
                            }
                            break;

                        // &quot;
                        case Ch('q'): 
                            if (src[2] == Ch('u') && src[3] == Ch('o') && src[4] == Ch('t') && src[5] == Ch(';'))
                            {
                                *dest = Ch('"');
                                ++dest;
                                src += 6;
                                continue;
                            }
                            break;

                        // &gt;
                        case Ch('g'): 
                            if (src[2] == Ch('t') && src[3] == Ch(';'))
                            {
                                *dest = Ch('>');
                                ++dest;
                                src += 4;
                                continue;
                            }
                            break;

                        // &lt;
                        case Ch('l'): 
                            if (src[2] == Ch('t') && src[3] == Ch(';'))
                            {
                                *dest = Ch('<');
                                ++dest;
                                src += 4;
                                continue;
                            }
                            break;

                        // &#...; - assumes ASCII
                        case Ch('#'): 
                            if (src[2] == Ch('x'))
                            {
                                unsigned long code = 0;
                                src += 3;   // Skip &#x
                                while (1)
                                {
                                    unsigned char digit = internal::lookup_tables<0>::lookup_digits[static_cast<unsigned char>(*src)];
                                    if (digit == 0xFF)
                                        break;
                                    code = code * 16 + digit;
                                    ++src;
                                }
                                insert_coded_character<Flags>(dest, code);    // Put character in output
                            }
                            else
                            {
                                unsigned long code = 0;
                                src += 2;   // Skip &#
                                while (1)
                                {
                                    unsigned char digit = internal::lookup_tables<0>::lookup_digits[static_cast<unsigned char>(*src)];
                                    if (digit == 0xFF)
                                        break;
                                    code = code * 10 + digit;
                                    ++src;
                                }
                                insert_coded_character<Flags>(dest, code);    // Put character in output
                            }
                            if (*src == Ch(';'))
                                ++src;
                            else
                                RAPIDXML_PARSE_ERROR("expected ;", src);
                            continue;

                        // Something else
                        default:
                            // Ignore, just copy '&' verbatim
                            break;

                        }
                    }
                }
                
                // If whitespace condensing is enabled
                if (Flags & parse_normalize_whitespace)
                {
                    // Test if condensing is needed                 
                    if (whitespace_pred::test(*src))
                    {
                        *dest = Ch(' '); ++dest;    // Put single space in dest
                        ++src;                      // Skip first whitespace char
                        // Skip remaining whitespace chars
                        while (whitespace_pred::test(*src))
                            ++src;
                        continue;
                    }
                }

                // No replacement, only copy character
                *dest++ = *src++;

            }

            // Return new end
            text = src;
            return dest;

        }